

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# khash_str2int.h
# Opt level: O0

int khash_str2int_inc(void *_hash,char *str)

{
  khint_t kVar1;
  kh_str2int_t *hash;
  int ret;
  khint_t k;
  char *str_local;
  void *_hash_local;
  
  if (_hash == (void *)0x0) {
    _hash_local._4_4_ = -1;
  }
  else {
    _ret = str;
    str_local = (char *)_hash;
    kVar1 = kh_put_str2int((kh_str2int_t *)_hash,str,(int *)&hash);
    if ((int)hash == 0) {
      _hash_local._4_4_ = *(int *)(*(long *)((long)_hash + 0x20) + (ulong)kVar1 * 4);
    }
    else {
      *(int *)(*(long *)((long)_hash + 0x20) + (ulong)kVar1 * 4) = *(int *)((long)_hash + 4) + -1;
      _hash_local._4_4_ = *(int *)(*(long *)((long)_hash + 0x20) + (ulong)kVar1 * 4);
    }
  }
  return _hash_local._4_4_;
}

Assistant:

static inline int khash_str2int_inc(void *_hash, const char *str)
{
    khint_t k;
    int ret;
    khash_t(str2int) *hash = (khash_t(str2int)*)_hash;
    if ( !hash ) return -1;
    k = kh_put(str2int, hash, str, &ret);
    if (ret == 0) return kh_val(hash, k);
    kh_val(hash, k) = kh_size(hash) - 1;
    return kh_val(hash, k);
}